

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
nestl::has_exceptions::list<int,_nestl::allocator<int>_>::list
          (list<int,_nestl::allocator<int>_> *this,list<int,_nestl::allocator<int>_> *other)

{
  bool bVar1;
  exception_ptr_error local_30;
  exception_ptr_error local_28;
  default_operation_error err;
  list<int,_nestl::allocator<int>_> *other_local;
  list<int,_nestl::allocator<int>_> *this_local;
  
  allocator<int>::allocator((allocator<int> *)((long)&err.m_exception._M_exception_object + 7));
  impl::list<int,_nestl::allocator<int>_>::list
            (&this->super_list<int,_nestl::allocator<int>_>,
             (allocator_type *)((long)&err.m_exception._M_exception_object + 7));
  allocator<int>::~allocator((allocator<int> *)((long)&err.m_exception._M_exception_object + 7));
  exception_ptr_error::exception_ptr_error(&local_28);
  impl::list<int,_nestl::allocator<int>_>::copy_nothrow<nestl::has_exceptions::exception_ptr_error>
            (&this->super_list<int,_nestl::allocator<int>_>,&local_28,
             &other->super_list<int,_nestl::allocator<int>_>);
  bVar1 = exception_ptr_error::operator_cast_to_bool(&local_28);
  if (bVar1) {
    exception_ptr_error::exception_ptr_error(&local_30,&local_28);
    throw_exception(&local_30);
    exception_ptr_error::~exception_ptr_error(&local_30);
  }
  exception_ptr_error::~exception_ptr_error(&local_28);
  return;
}

Assistant:

list(const list& other)
    {
        default_operation_error err;
        this->copy_nothrow(err, other);
        if (err)
        {
            throw_exception(err);
        }
    }